

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O0

void get_squared_error(uint16_t *frame1,uint stride,uint16_t *frame2,uint stride2,int block_width,
                      int block_height,uint32_t *frame_sse,uint dst_stride)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar7 [16];
  uint32_t *dst;
  uint16_t *src2;
  uint16_t *src1;
  int local_130;
  int local_12c;
  uint16_t *local_128;
  long local_120;
  long local_118;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  __m128i vres2;
  __m128i vres1;
  __m128i vmullh;
  __m128i vmullo;
  __m128i vdiff;
  __m128i vsrc2;
  __m128i vsrc1;
  int j;
  int i;
  
  local_128 = src2;
  local_120 = in_RDX;
  local_118 = in_RDI;
  for (local_12c = 0; local_12c < in_R9D; local_12c = local_12c + 1) {
    for (local_130 = 0; local_130 < in_R8D; local_130 = local_130 + 8) {
      puVar1 = (undefined8 *)(local_118 + (long)local_130 * 2);
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      puVar1 = (undefined8 *)(local_120 + (long)local_130 * 2);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      local_c8 = (short)uVar2;
      sStack_c6 = (short)((ulong)uVar2 >> 0x10);
      sStack_c4 = (short)((ulong)uVar2 >> 0x20);
      sStack_c2 = (short)((ulong)uVar2 >> 0x30);
      sStack_c0 = (short)uVar3;
      sStack_be = (short)((ulong)uVar3 >> 0x10);
      sStack_bc = (short)((ulong)uVar3 >> 0x20);
      sStack_ba = (short)((ulong)uVar3 >> 0x30);
      local_d8 = (short)uVar4;
      sStack_d6 = (short)((ulong)uVar4 >> 0x10);
      sStack_d4 = (short)((ulong)uVar4 >> 0x20);
      sStack_d2 = (short)((ulong)uVar4 >> 0x30);
      sStack_d0 = (short)uVar5;
      sStack_ce = (short)((ulong)uVar5 >> 0x10);
      sStack_cc = (short)((ulong)uVar5 >> 0x20);
      sStack_ca = (short)((ulong)uVar5 >> 0x30);
      local_c8 = local_c8 - local_d8;
      sStack_c6 = sStack_c6 - sStack_d6;
      sStack_c4 = sStack_c4 - sStack_d4;
      sStack_c2 = sStack_c2 - sStack_d2;
      sStack_c0 = sStack_c0 - sStack_d0;
      sStack_be = sStack_be - sStack_ce;
      sStack_bc = sStack_bc - sStack_cc;
      sStack_ba = sStack_ba - sStack_ca;
      uVar2 = CONCAT26(sStack_c2,CONCAT24(sStack_c4,CONCAT22(sStack_c6,local_c8)));
      uVar3 = CONCAT26(sStack_ba,CONCAT24(sStack_bc,CONCAT22(sStack_be,sStack_c0)));
      auVar6._8_8_ = uVar3;
      auVar6._0_8_ = uVar2;
      auVar7._8_8_ = uVar3;
      auVar7._0_8_ = uVar2;
      auVar7 = pmulhw(auVar6,auVar7);
      vres2[1]._0_2_ = auVar7._0_2_;
      vres2[1]._2_2_ = auVar7._2_2_;
      vres2[1]._4_2_ = auVar7._4_2_;
      vres2[1]._6_2_ = auVar7._6_2_;
      vmullo[0]._0_2_ = auVar7._8_2_;
      vmullo[0]._2_2_ = auVar7._10_2_;
      vmullo[0]._4_2_ = auVar7._12_2_;
      vmullo[0]._6_2_ = auVar7._14_2_;
      *(ulong *)(local_128 + (long)local_130 * 2 + 4) =
           CONCAT26(vres2[1]._2_2_,
                    CONCAT24(sStack_c6 * sStack_c6,
                             CONCAT22((undefined2)vres2[1],local_c8 * local_c8)));
      *(ulong *)(local_128 + (long)local_130 * 2 + 8) =
           CONCAT26(vres2[1]._6_2_,
                    CONCAT24(sStack_c2 * sStack_c2,CONCAT22(vres2[1]._4_2_,sStack_c4 * sStack_c4)));
      *(ulong *)(local_128 + (long)local_130 * 2 + 0xc) =
           CONCAT26(vmullo[0]._2_2_,
                    CONCAT24(sStack_be * sStack_be,
                             CONCAT22((undefined2)vmullo[0],sStack_c0 * sStack_c0)));
      *(ulong *)(local_128 + (long)local_130 * 2 + 0x10) =
           CONCAT26(vmullo[0]._6_2_,
                    CONCAT24(sStack_ba * sStack_ba,CONCAT22(vmullo[0]._4_2_,sStack_bc * sStack_bc)))
      ;
    }
    local_118 = local_118 + (ulong)in_ESI * 2;
    local_120 = local_120 + (ulong)in_ECX * 2;
    local_128 = local_128 + (ulong)(uint)src1 * 2;
  }
  return;
}

Assistant:

static void get_squared_error(const uint16_t *frame1, const unsigned int stride,
                              const uint16_t *frame2,
                              const unsigned int stride2, const int block_width,
                              const int block_height, uint32_t *frame_sse,
                              const unsigned int dst_stride) {
  const uint16_t *src1 = frame1;
  const uint16_t *src2 = frame2;
  uint32_t *dst = frame_sse;

  for (int i = 0; i < block_height; i++) {
    for (int j = 0; j < block_width; j += 8) {
      __m128i vsrc1 = _mm_loadu_si128((__m128i *)(src1 + j));
      __m128i vsrc2 = _mm_loadu_si128((__m128i *)(src2 + j));

      __m128i vdiff = _mm_sub_epi16(vsrc1, vsrc2);
      __m128i vmullo = _mm_mullo_epi16(vdiff, vdiff);
      __m128i vmullh = _mm_mulhi_epi16(vdiff, vdiff);

      __m128i vres1 = _mm_unpacklo_epi16(vmullo, vmullh);
      __m128i vres2 = _mm_unpackhi_epi16(vmullo, vmullh);

      _mm_storeu_si128((__m128i *)(dst + j + 2), vres1);
      _mm_storeu_si128((__m128i *)(dst + j + 6), vres2);
    }

    src1 += stride;
    src2 += stride2;
    dst += dst_stride;
  }
}